

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall RandStrAtom::generate(RandStrAtom *this,wchar_t **dst)

{
  wchar_t *pwVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  int iVar4;
  RandStrRange *r;
  RandStrNode *pRVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  wchar_t wVar10;
  uint uVar11;
  bool bVar12;
  
  if (this->listChars != 0) {
    uVar2 = rng_next();
    pRVar5 = (this->super_RandStrNode).firstChild;
    if (pRVar5 == (RandStrNode *)0x0) {
      return;
    }
    uVar6 = (uint)this->listChars >> 0x10;
    uVar11 = this->listChars & 0xffff;
    uVar9 = (uVar2 >> 0x10) * uVar11;
    uVar7 = uVar6 * (uVar2 & 0xffff);
    iVar8 = ((uVar7 & 0xffff) + (uVar9 & 0xffff) + ((uVar2 & 0xffff) * uVar11 >> 0x10) >> 0x10) +
            (uVar7 >> 0x10) + (uVar9 >> 0x10) + uVar6 * (uVar2 >> 0x10);
    while( true ) {
      uVar6 = *(int *)((long)&pRVar5[1]._vptr_RandStrNode + 4) -
              *(int *)&pRVar5[1]._vptr_RandStrNode;
      if (iVar8 <= (int)uVar6) break;
      iVar8 = iVar8 + ~uVar6;
      pRVar5 = pRVar5->nextSibling;
      if (pRVar5 == (RandStrNode *)0x0) {
        return;
      }
    }
    wVar3 = *(int *)&pRVar5[1]._vptr_RandStrNode + iVar8;
    goto LAB_0025d57c;
  }
  if (this->isLit != 0) {
    wVar3 = this->ch;
    goto LAB_0025d57c;
  }
  uVar6 = rng_next();
  wVar3 = this->ch;
  if (L't' < wVar3) {
    if (wVar3 == L'z') {
      uVar7 = (uVar6 >> 0x10) * 0x3e;
      uVar6 = (((uVar6 & 0xffff) * 0x3e >> 0x10) + (uVar7 & 0xffff) >> 0x10) + (uVar7 >> 0x10);
      iVar8 = 0x57;
      if (0x23 < uVar6) {
        iVar8 = 0x1d;
      }
      iVar4 = 0x30;
      if (9 < uVar6) {
        iVar4 = iVar8;
      }
      wVar3 = iVar4 + uVar6;
    }
    else {
      if (wVar3 == L'x') {
        wVar3 = (uVar6 >> 0x1c) + L'W';
        goto LAB_0025d810;
      }
      if (wVar3 != L'u') {
        return;
      }
      iVar8 = t3_get_chartype(L'u');
      while (iVar8 == 0) {
        uVar6 = rng_next();
        iVar8 = t3_get_chartype(this->ch);
      }
      uVar7 = (uVar6 >> 0x10) * 0xe6bf;
      uVar6 = (((uVar6 & 0xffff) * 0xe6bf >> 0x10) + (uVar7 & 0xffff) >> 0x10) + (uVar7 >> 0x10);
      iVar8 = 0x40;
      if (0xdfbf < uVar6) {
        iVar8 = 0x1940;
      }
      iVar4 = 0x20;
      if (0x5f < uVar6) {
        iVar4 = iVar8;
      }
      wVar3 = iVar4 + uVar6;
    }
    goto LAB_0025d57c;
  }
  switch(wVar3) {
  case L'a':
    uVar7 = (uVar6 >> 0x10) * 0x1a;
    wVar3 = (uVar7 >> 0x10) + (((uVar6 & 0xffff) * 0x1a >> 0x10) + (uVar7 & 0xffff) >> 0x10) + L'a';
    break;
  case L'b':
    wVar3 = uVar6 >> 0x18;
    break;
  case L'c':
    uVar7 = (uVar6 >> 0x10) * 0x34;
    uVar9 = uVar7 >> 0x10;
    uVar6 = ((uVar6 & 0xffff) * 0x34 >> 0x10) + (uVar7 & 0xffff) >> 0x10;
    bVar12 = uVar6 + uVar9 < 0x1a;
    wVar10 = uVar6 + 0x27 + uVar9;
    wVar3 = uVar6 + 0x61 + uVar9;
    goto LAB_0025d79c;
  case L'd':
    uVar7 = (uVar6 >> 0xf & 0xfffffffe) * 5;
    wVar3 = (((uVar6 & 0xffff) * 10 >> 0x10) + (uVar7 & 0xffff) >> 0x10) + (uVar7 >> 0x10) + L'0';
    break;
  case L'e':
  case L'f':
  case L'g':
  case L'h':
  case L'j':
  case L'k':
    goto switchD_0025d5be_caseD_65;
  case L'i':
    uVar7 = (uVar6 >> 0x10) * 0x5f;
    wVar3 = (uVar7 >> 0x10) + (((uVar6 & 0xffff) * 0x5f >> 0x10) + (uVar7 & 0xffff) >> 0x10) + L' ';
    break;
  case L'l':
    uVar7 = (uVar6 >> 0x10) * 0xbf;
    uVar9 = uVar7 >> 0x10;
    uVar6 = ((uVar6 & 0xffff) * 0xbf >> 0x10) + (uVar7 & 0xffff) >> 0x10;
    bVar12 = uVar6 + uVar9 < 0x5f;
    wVar10 = uVar6 + 0x41 + uVar9;
    wVar3 = uVar6 + 0x20 + uVar9;
LAB_0025d79c:
    if (!bVar12) {
      wVar3 = wVar10;
    }
    break;
  default:
    if (wVar3 == L'A') {
      uVar7 = (uVar6 >> 0x10) * 0x1a;
      wVar3 = (uVar7 >> 0x10) + (((uVar6 & 0xffff) * 0x1a >> 0x10) + (uVar7 & 0xffff) >> 0x10) +
              L'A';
    }
    else {
      if (wVar3 != L'X') {
        return;
      }
      wVar3 = (uVar6 >> 0x1c) + L'7';
LAB_0025d810:
      if (uVar6 < 0xa0000000) {
        wVar3 = (uVar6 >> 0x1c) + L'0';
      }
    }
  }
LAB_0025d57c:
  pwVar1 = *dst;
  *dst = pwVar1 + 1;
  *pwVar1 = wVar3;
switchD_0025d5be_caseD_65:
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        /* 
         *   If we have a character list expression, choose a character from
         *   the list.  Otherwise, generate a character according to our
         *   character class code.  
         */
        wchar_t outc = L'\0';
        if (listChars != 0)
        {
            /* pick a random index in our range */
            wchar_t n = (wchar_t)rand_range(rng_next(vmg0_), listChars);

			/* find the range containing this character */
			int picked = FALSE;
            for (RandStrNode *chi = firstChild ; chi != 0 ;
                 chi = chi->nextSibling)
            {
                /* cast the child - we know it's a range node */
                RandStrRange *r = (RandStrRange *)chi;

                /* if the index is in this range, we've found it */
                if (n <= r->c2 - r->c1)
                {
					outc = r->c1 + n;
					picked = TRUE;
                    break;
                }

                /* deduct the size of this range from the index */
                n -= (r->c2 - r->c1 + 1);
			}

			/* 
			 *   if we didn't pick a character, something's wrong - return
			 *   without generating anything 
			 */
			if (!picked)
				return;
        }
        else if (isLit)
        {
            /* literal character expression */
            outc = ch;
        }
        else
        {
            /* no list, so generate a character based on the class code */
            ulong rand_val = rng_next(vmg0_);
            switch (ch)
            {
            case 'i':
                /* printable ASCII character 32-126 */
                outc = (wchar_t)rand_range(rand_val, 32, 126);
                break;
                
            case 'l':
                /* printable Latin-1 character 32-126, 160-255 */
                outc = (wchar_t)rand_range(rand_val, 32, 126, 160, 255);
                break;
                
            case 'u':
                /* 
                 *   Printable Unicode character.  This excludes undefined
                 *   character, the private use area, and the control
                 *   characters.  
                 */
                for (;;)
                {
                    /* exclude the control and private use ranges */
                    outc = (wchar_t)rand_range(
                        rand_val, 32, 127, 160, 0xDFFF, 0xF900, 0xFFFE);
                    
                    /* if it's a unicode character, we're set */
                    if (t3_is_unichar(ch))
                        break;
                    
                    /* pick a new random number */
                    rand_val = rng_next(vmg0_);
                }
                break;
                
            case 'd':
                /* decimal digit 0-9 */
                outc = (wchar_t)rand_range(rand_val, '0', '9');
                break;
                
            case 'X':
                /* upper-case hex digit 0-9 A-F */
                outc = (wchar_t)rand_range(rand_val, '0', '9', 'A', 'F');
                break;
                
            case 'x':
                /* lower-case hex digit 0-9 a-f */
                outc = (wchar_t)rand_range(rand_val, '0', '9', 'a', 'f');
                break;
                
            case 'A':
                /* letter A-Z */
                outc = (wchar_t)rand_range(rand_val, 'A', 'Z');
                break;
                
            case 'a':
                /* letter a-z */
                outc = (wchar_t)rand_range(rand_val, 'a', 'z');
                break;
                
            case 'b':
                /* random byte value 0-255 */
                outc = (wchar_t)rand_range(rand_val, 0, 255);
                break;
                
            case 'c':
                /* mixed-case letter A-Z a-z */
                outc = (wchar_t)rand_range(rand_val, 'a', 'z', 'A', 'Z');
                break;
                
            case 'z':
                /* mixed-case letter or number 0-9 a-z A-Z */
                outc = (wchar_t)rand_range(rand_val,
                                           '0', '9', 'a', 'z', 'A', 'Z');
                break;

            default:
                /* no character */
                return;
            }
        }

        /* store the output character */
        *dst++ = outc;
    }